

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinePath.cpp
# Opt level: O2

void __thiscall
chrono::geometry::ChLinePath::InsertSubLine
          (ChLinePath *this,size_t n,shared_ptr<chrono::geometry::ChLine> *mline,double duration)

{
  double local_20;
  
  std::
  vector<std::shared_ptr<chrono::geometry::ChLine>,_std::allocator<std::shared_ptr<chrono::geometry::ChLine>_>_>
  ::insert(&this->lines,
           (this->lines).
           super__Vector_base<std::shared_ptr<chrono::geometry::ChLine>,_std::allocator<std::shared_ptr<chrono::geometry::ChLine>_>_>
           ._M_impl.super__Vector_impl_data._M_start + n,mline);
  local_20 = 0.0;
  std::vector<double,_std::allocator<double>_>::emplace_back<double>(&this->durations,&local_20);
  local_20 = 0.0;
  std::vector<double,_std::allocator<double>_>::emplace_back<double>(&this->end_times,&local_20);
  SetSubLineDurationN(this,n,duration);
  return;
}

Assistant:

void ChLinePath::InsertSubLine(size_t n, std::shared_ptr<ChLine> mline, double duration) {
    lines.insert(lines.begin() + n, mline);
    durations.push_back(0);
    end_times.push_back(0);
    // force recompute following end times:
    SetSubLineDurationN(n, duration);
}